

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bsp.cc
# Opt level: O3

void mcbsp_hpput(mcbsp_pid_t pid,void *src,void *dst,mcbsp_size_t offset,mcbsp_size_t size)

{
  pointer pMVar1;
  ulong uVar2;
  void *pvVar3;
  Memslot dst_slot;
  long lVar4;
  long lVar5;
  
  if ((s_spmd == (Spmd *)0x0) || (s_spmd->m_closed == true)) {
    bsp_abort("bsp_put: can only be called within SPMD section\n");
  }
  if (size == 0) {
    return;
  }
  if ((uint)s_spmd->m_nprocs < pid) {
    bsp_abort("bsp_hpput: The destination process ID does not exist\n");
  }
  if (dst != (void *)0x0) {
    dst_slot = lookup_usable_reg(dst,"bsp_hpput");
    lVar4 = (long)s_rdma->m_nprocs * dst_slot;
    pMVar1 = (s_rdma->m_used_slots).
             super__Vector_base<bsplib::Rdma::Memblock,_std::allocator<bsplib::Rdma::Memblock>_>.
             _M_impl.super__Vector_impl_data._M_start;
    uVar2 = pMVar1[lVar4 + (int)pid].size;
    lVar5 = (size + offset) - uVar2;
    if (uVar2 <= size + offset && lVar5 != 0) {
      pvVar3 = pMVar1[lVar4 + (int)pid].addr;
      bsp_abort("bsp_hpput: Writes %zu bytes beyond registered range [%p,%p+%zu) at process %d\n",
                lVar5,pvVar3,pvVar3,uVar2,pid);
    }
    if (s_spmd->m_pid == pid) {
      memcpy((void *)((long)dst + offset),src,size);
      return;
    }
    bsplib::Rdma::hpput(s_rdma,src,pid,dst_slot,offset,size);
    return;
  }
  bsp_abort("bsp_hpput: Destination address cannot be identified by NULL\n");
  __assert_fail("addr != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/wijnand-suijlen[P]bsponmpi/src/bsp.cc"
                ,0x168,"bsplib::Rdma::Memslot lookup_usable_reg(const void *, const char *)");
}

Assistant:

void mcbsp_hpput( mcbsp_pid_t pid, const void * src,
             const void * dst, mcbsp_size_t offset, mcbsp_size_t size )
{
#ifdef PROFILE
    TicToc t( TicToc::HPPUT, size );
#endif

    if (!s_spmd || s_spmd->closed())
        bsp_abort("bsp_put: can only be called within SPMD section\n");

    if (size == 0) // ignore any empty writes
        return;

    if (pid > mcbsp_pid_t(s_spmd->nprocs()))
        bsp_abort("bsp_hpput: The destination process ID does not exist\n");
    if ( dst == NULL )
        bsp_abort("bsp_hpput: Destination address cannot be identified by NULL\n");

    bsplib::Rdma::Memslot dst_slot_id = lookup_usable_reg( dst, "bsp_hpput" );
    bsplib::Rdma::Memblock dst_slot = s_rdma->slot( pid, dst_slot_id );

    if ( size_t(offset + size ) > dst_slot.size )
        bsp_abort("bsp_hpput: Writes %zu bytes beyond registered "
                  "range [%p,%p+%zu) at process %d\n",
                  offset + size - dst_slot.size,
                  dst_slot.addr, dst_slot.addr, dst_slot.size, pid );

    if (pid == mcbsp_pid_t(s_spmd->pid()) )
    {
        char * d = static_cast<char *>(const_cast<void *>(dst));
        std::memcpy(d + offset, src, size );
    }
    else
    {
        s_rdma->hpput( src, pid, dst_slot_id, offset, size );
    }
}